

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::
make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_long>
::operator()(make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_long>
             *this,stringstream *msg,char *arg,duration<long,_std::ratio<1L,_1000000000L>_> args,
            char *args_1,long args_2)

{
  make_exception<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_long>
  local_39;
  long local_38;
  long args_local_2;
  char *args_local_1;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_long>
  *this_local;
  duration<long,_std::ratio<1L,_1000000000L>_> args_local;
  
  local_38 = args_2;
  args_local_2 = (long)args_1;
  args_local_1 = arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  this_local = (make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_long>
                *)args.__r;
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_long>::
  operator()(&local_39,(stringstream *)arg_local,
             (duration<long,_std::ratio<1L,_1000000000L>_>)this_local,(char *)args_local_2,local_38)
  ;
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }